

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.h
# Opt level: O2

void Logger::printLine<int,int,int,char[12],char[9]>
               (char *text,int *args,int *args_1,int *args_2,char (*args_3) [12],char (*args_4) [9])

{
  char *extraout_RDX;
  string_view text_00;
  string message;
  char (*in_stack_ffffffffffffffd0) [9];
  string local_28;
  
  tinyformat::format<int,int,int,char[12],char[9]>
            (&local_28,(tinyformat *)text,(char *)args,args_1,args_2,(int *)args_3,
             (char (*) [12])args_4,in_stack_ffffffffffffffd0);
  text_00._M_str = extraout_RDX;
  text_00._M_len = (size_t)local_28._M_dataplus._M_p;
  printLine((Logger *)local_28._M_string_length,text_00);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

static void printLine(const char* text, const Args&... args)
	{
		std::string message = tfm::format(text,args...);
		printLine(message);
	}